

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O1

void close_unix_descriptors(void)

{
  undefined8 uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  undefined8 in_RAX;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  undefined8 uStack_38;
  
  if (NPROCS < 1) {
    uStack_38._1_7_ = (uint7)((ulong)in_RAX >> 8) & 0xffff0000000000;
    uStack_38 = CONCAT71(uStack_38._1_7_,0x57);
    write(UnixPipeOut,&uStack_38,6);
    iVar2 = UnixPipeIn;
    sVar3 = read(UnixPipeIn,&uStack_38,6);
    if (sVar3 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar3 = read(iVar2,&uStack_38,6);
      } while (sVar3 < 0);
    }
    iVar2 = CONCAT13(uStack_38._5_1_,
                     CONCAT12(uStack_38._4_1_,(ushort)uStack_38 << 8 | (ushort)uStack_38 >> 8));
    uVar1 = uStack_38;
    do {
      if (iVar2 == 0) {
        return;
      }
      uVar5 = 0xffffffff;
      if (0 < (long)NPROCS) {
        piVar4 = &UJ->PID;
        lVar8 = 0;
        do {
          if (*piVar4 == iVar2) {
            uVar5 = (uint)lVar8;
            break;
          }
          lVar8 = lVar8 + 1;
          piVar4 = piVar4 + 6;
        } while (NPROCS != lVar8);
      }
      if (-1 < (int)uVar5) {
        uStack_38._2_1_ = (byte)((ulong)uVar1 >> 0x10);
        uStack_38._3_1_ = (byte)((ulong)uVar1 >> 0x18);
        uVar6 = (uint)uStack_38._3_1_;
        if (uStack_38._2_1_ != 0) {
          uVar6 = (uint)uStack_38._2_1_ << 8;
        }
        UJ[uVar5].status = uVar6;
      }
      uStack_38._1_7_ = (uint7)((ulong)uVar1 >> 8) & 0xffff0000000000;
      uStack_38 = CONCAT71(uStack_38._1_7_,0x57);
      write(UnixPipeOut,&uStack_38,6);
      iVar2 = UnixPipeIn;
      sVar3 = read(UnixPipeIn,&uStack_38,6);
      if (sVar3 < 0) {
        piVar4 = __errno_location();
        do {
          if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
            perror("reading UnixPipeIn");
            break;
          }
          sVar3 = read(iVar2,&uStack_38,6);
        } while (sVar3 < 0);
      }
      iVar2 = CONCAT13(uStack_38._5_1_,
                       CONCAT12(uStack_38._4_1_,(ushort)uStack_38 << 8 | (ushort)uStack_38 >> 8));
      uVar1 = uStack_38;
    } while( true );
  }
  lVar8 = 0;
  lVar9 = 0;
  do {
    switch(*(undefined4 *)((long)&UJ->type + lVar8)) {
    case 0xfffffffc:
      goto switchD_00137694_caseD_fffffffc;
    case 0xfffffffd:
      close((int)lVar9);
      pcVar7 = *(char **)((long)&UJ->pathname + lVar8);
      if (pcVar7 != (char *)0x0) {
        unlink(pcVar7);
        free(*(void **)((long)&UJ->pathname + lVar8));
        *(undefined8 *)((long)&UJ->pathname + lVar8) = 0;
      }
      break;
    case 0xfffffffe:
      iVar2 = kill(*(__pid_t *)((long)&UJ->PID + lVar8),9);
      if (iVar2 < 0) {
        pcVar7 = "Killing process";
LAB_00137743:
        perror(pcVar7);
      }
      goto LAB_001376ff;
    case 0xffffffff:
      iVar2 = kill(*(__pid_t *)((long)&UJ->PID + lVar8),9);
      if (iVar2 < 0) {
        pcVar7 = "Killing shell";
        goto LAB_00137743;
      }
LAB_001376ff:
      *(undefined4 *)((long)&UJ->PID + lVar8) = 0;
switchD_00137694_caseD_fffffffc:
      close((int)lVar9);
    }
    *(undefined4 *)((long)&UJ->type + lVar8) = 0;
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x18;
    if (NPROCS <= lVar9) {
      wait_for_comm_processes();
      return;
    }
  } while( true );
}

Assistant:

void close_unix_descriptors(void) /* Get ready to shut Maiko down */
{
  for (int slot = 0; slot < NPROCS; slot++) {
    /* If this slot has an active job */
    switch (UJ[slot].type) {
      case UJUNUSED:
        break;
      case UJSHELL:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing shell");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing shell desc %d.\n", slot));
        close(slot);
        break;

      case UJPROCESS:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing process");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing process desc %d.\n", slot));
        close(slot);
        break;

      case UJSOCKET:
        close(slot);
        if (UJ[slot].pathname != NULL) {
          /* socket created directly from Lisp; pathname is in .pathname */
          DBPRINT(("Closing socket %d bound to %s\n", slot, UJ[slot].pathname));
          unlink(UJ[slot].pathname);
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;

      case UJSOSTREAM: close(slot); break;
    }
    UJ[slot].type = UJUNUSED;
  }

  /* make sure everyone's really dead before proceeding */
  wait_for_comm_processes();
}